

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O1

int b_rshift(lua_State *L)

{
  lua_Unsigned lVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_Unsigned u;
  
  lVar1 = luaL_checkunsigned(L,1);
  lVar3 = luaL_checkinteger(L,2);
  iVar2 = (int)lVar3;
  if (iVar2 < 1) {
    u = 0;
    if (-0x20 < iVar2) {
      u = lVar1 << (-(byte)lVar3 & 0x1f);
    }
  }
  else {
    u = 0;
    if (iVar2 < 0x20) {
      u = lVar1 >> ((byte)lVar3 & 0x1f);
    }
  }
  lua_pushunsigned(L,u);
  return 1;
}

Assistant:

static int b_rshift (lua_State *L) {
  return b_shift(L, luaL_checkunsigned(L, 1), -luaL_checkint(L, 2));
}